

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenAddTagImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,BinaryenType params,BinaryenType results)

{
  IString *pIVar1;
  Global *pGVar2;
  undefined1 reuse;
  char *pcVar3;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var4;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view sVar5;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  __single_object tag;
  
  pcVar3 = externalBaseName;
  pIVar1 = (IString *)strlen(internalName);
  sVar5._M_str = (char *)0x0;
  sVar5._M_len = (size_t)internalName;
  reuse = SUB81(pcVar3,0);
  sVar5 = wasm::IString::interned(pIVar1,sVar5,(bool)reuse);
  pGVar2 = wasm::Module::getGlobalOrNull(module,(Name)sVar5);
  if (pGVar2 == (Global *)0x0) {
    local_38._M_head_impl = (Tag *)operator_new(0x48);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         (char *)0x0;
    *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
    ((local_38._M_head_impl)->sig).params.id = 0;
    ((local_38._M_head_impl)->sig).results.id = 0;
    pIVar1 = (IString *)strlen(internalName);
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)internalName;
    sVar5 = wasm::IString::interned(pIVar1,s_01,(bool)reuse);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalModuleName);
    s_02._M_str = (char *)0x0;
    s_02._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s_02,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str = sVar5;
    _Var4._M_head_impl = local_38._M_head_impl;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_03._M_str = (char *)0x0;
    s_03._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_03,SUB81(_Var4._M_head_impl,0));
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str = sVar5;
    ((local_38._M_head_impl)->sig).params.id = params;
    ((local_38._M_head_impl)->sig).results.id = results;
    wasm::Module::addTag(module,(unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38)
    ;
    if (local_38._M_head_impl != (Tag *)0x0) {
      operator_delete(local_38._M_head_impl,0x48);
    }
  }
  else {
    pIVar1 = (IString *)strlen(externalModuleName);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)externalModuleName;
    sVar5 = wasm::IString::interned(pIVar1,s,(bool)reuse);
    (pGVar2->super_Importable).module.super_IString.str = sVar5;
    pIVar1 = (IString *)strlen(externalBaseName);
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)externalBaseName;
    sVar5 = wasm::IString::interned(pIVar1,s_00,(bool)reuse);
    (pGVar2->super_Importable).base.super_IString.str = sVar5;
  }
  return;
}

Assistant:

void BinaryenAddTagImport(BinaryenModuleRef module,
                          const char* internalName,
                          const char* externalModuleName,
                          const char* externalBaseName,
                          BinaryenType params,
                          BinaryenType results) {
  auto* tag = ((Module*)module)->getGlobalOrNull(internalName);
  if (tag == nullptr) {
    auto tag = std::make_unique<Tag>();
    tag->name = internalName;
    tag->module = externalModuleName;
    tag->base = externalBaseName;
    tag->sig = Signature(Type(params), Type(results));
    ((Module*)module)->addTag(std::move(tag));
  } else {
    // already exists so just set module and base
    tag->module = externalModuleName;
    tag->base = externalBaseName;
  }
}